

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void pnga_fill_patch(Integer g_a,Integer *lo,Integer *hi,void *val)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  logical lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Integer icode;
  long lVar11;
  char *pcVar12;
  long lVar13;
  Integer IVar14;
  bool bVar15;
  char *data_ptr;
  undefined8 uStack_550;
  Integer loA [7];
  Integer type;
  Integer ndim;
  Integer hiA [7];
  long local_4b8 [8];
  Integer *local_478;
  Integer *local_470 [9];
  Integer bunit [7];
  Integer ld [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  
  local_478 = lo;
  local_470[0] = hi;
  pnga_nodeid();
  bVar15 = _ga_sync_begin != 0;
  uStack_550._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar15) {
    pnga_sync();
  }
  pnga_inquire(g_a,&type,&ndim,dims);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&hdl);
  lVar3 = 1;
  do {
    do {
      iVar5 = pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld);
      IVar14 = ndim;
      if (iVar5 == 0) {
        if (uStack_550._4_4_ != 0) {
          pnga_sync();
        }
        return;
      }
      lVar9 = 0;
      if (0 < ndim) {
        lVar9 = ndim;
      }
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        loS[lVar6] = loA[lVar6];
      }
      lVar7 = pnga_patch_intersect(local_478,local_470[0],loA,hiA,ndim);
    } while (lVar7 == 0);
    lVar6 = 0;
    do {
      lVar13 = lVar3;
      lVar11 = lVar3;
      icode = type;
      if (lVar9 == lVar6) goto LAB_0011f25e;
      plVar2 = loS + lVar6;
      plVar1 = loA + lVar6;
      lVar6 = lVar6 + 1;
    } while (*plVar1 <= *plVar2);
    lVar9 = IVar14 + -1;
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    lVar8 = 0;
    lVar6 = lVar3;
    for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
      lVar8 = lVar8 + (loA[lVar10] - loS[lVar10]) * lVar6;
      lVar6 = lVar6 * ld[lVar10];
    }
    if (0xf < type - 0x3e9U) {
switchD_0011f1cd_caseD_3ed:
      pnga_error(" wrong data type ",type);
      IVar14 = ndim;
      icode = type;
      goto LAB_0011f25e;
    }
    lVar8 = ((&uStack_550)[IVar14] - loS[IVar14 + -1]) * lVar6 + lVar8;
    switch(type) {
    case 0x3e9:
      data_ptr = data_ptr + lVar8 * 4;
      icode = 0x3e9;
      break;
    case 0x3ea:
      data_ptr = data_ptr + lVar8 * 8;
      icode = 0x3ea;
      break;
    case 0x3eb:
      data_ptr = data_ptr + lVar8 * 4;
      icode = 0x3eb;
      break;
    case 0x3ec:
      data_ptr = data_ptr + lVar8 * 8;
      icode = 0x3ec;
      break;
    default:
      goto switchD_0011f1cd_caseD_3ed;
    case 0x3ee:
      lVar8 = lVar8 * 8;
      goto LAB_0011f24b;
    case 0x3ef:
      lVar8 = lVar8 * 0x10;
LAB_0011f24b:
      data_ptr = data_ptr + lVar8;
      break;
    case 0x3f8:
      data_ptr = data_ptr + lVar8 * 8;
      icode = 0x3f8;
    }
LAB_0011f25e:
    for (; lVar13 < IVar14; lVar13 = lVar13 + 1) {
      plVar1 = hiA + lVar13;
      plVar2 = loA + lVar13;
      lVar11 = lVar11 * ((*plVar1 - *plVar2) + 1);
    }
    local_4b8[0] = 0;
    local_4b8[1] = 0;
    bunit[0] = 1;
    bunit[1] = 1;
    local_470[1] = (Integer *)ld[0];
    local_470[2] = (Integer *)(ld[0] * ld[1]);
    for (lVar9 = 2; lVar9 < IVar14; lVar9 = lVar9 + 1) {
      local_4b8[lVar9] = 0;
      bunit[lVar9] = ((hiA[lVar9 + -1] - (&uStack_550)[lVar9]) + 1) * bunit[lVar9 + -1];
      local_470[lVar9 + 1] = (Integer *)(ld[lVar9] * (long)local_470[lVar9]);
    }
    switch(icode) {
    case 0x3e9:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          *(undefined4 *)(data_ptr + lVar6 * 4 + lVar13 * 4) = *val;
        }
      }
      break;
    case 0x3ea:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          *(undefined8 *)(data_ptr + lVar6 * 8 + lVar13 * 8) = *val;
        }
      }
      break;
    case 0x3eb:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          *(undefined4 *)(data_ptr + lVar6 * 4 + lVar13 * 4) = *val;
        }
      }
      break;
    case 0x3ec:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          *(undefined8 *)(data_ptr + lVar6 * 8 + lVar13 * 8) = *val;
        }
      }
      break;
    default:
      pnga_error(" wrong data type ",icode);
      break;
    case 0x3ee:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          *(undefined8 *)(data_ptr + lVar6 * 8 + lVar13 * 8) = *val;
        }
      }
      break;
    case 0x3ef:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        pcVar12 = data_ptr + lVar13 * 0x10;
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          uVar4 = *(undefined8 *)((long)val + 8);
          *(undefined8 *)pcVar12 = *val;
          *(undefined8 *)(pcVar12 + 8) = uVar4;
          pcVar12 = pcVar12 + 0x10;
        }
      }
      break;
    case 0x3f8:
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      lVar9 = 0;
      while (lVar9 != lVar11) {
        lVar9 = lVar9 + 1;
        lVar13 = 0;
        for (lVar6 = lVar3; lVar6 < IVar14; lVar6 = lVar6 + 1) {
          lVar13 = lVar13 + (long)local_470[lVar6] * local_4b8[lVar6];
          lVar10 = local_4b8[lVar6] + (ulong)(lVar9 % bunit[lVar6] == 0);
          lVar8 = 0;
          if (lVar10 <= hiA[lVar6] - loA[lVar6]) {
            lVar8 = lVar10;
          }
          local_4b8[lVar6] = lVar8;
        }
        for (lVar6 = 0; lVar6 <= hiA[0] - loA[0]; lVar6 = lVar6 + 1) {
          *(undefined8 *)(data_ptr + lVar6 * 8 + lVar13 * 8) = *val;
        }
      }
    }
  } while( true );
}

Assistant:

void pnga_fill_patch(Integer g_a, Integer *lo, Integer *hi, void* val)
{
  Integer i;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer num_blocks, nproc;
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync(); 


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;     
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;                          
          case C_LONGLONG:
            data_ptr = (void*)((long long*)data_ptr + offset);
            break;                          
          default: pnga_error(" wrong data type ",type);
        }
      }

      /* set all values in patch to *val */
      snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);
    }
  }
#else
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */ 
    pnga_distribution(g_a, me, loA, hiA);

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* set all values in patch to *val */
      snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of patch */ 
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;     
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;                          
              case C_LONGLONG:
                data_ptr = (void*)((long long*)data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;     
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;                          
              case C_LONGLONG:
                data_ptr = (void*)((long long*)data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}